

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double chi_square_cdf_inv(double cdf,double a)

{
  double p;
  double dVar1;
  double dVar2;
  double dVar3;
  __type _Var4;
  double dVar5;
  double dVar6;
  double dVar7;
  double xx;
  double x2;
  double x;
  double t;
  double s6;
  double s5;
  double s4;
  double s3;
  double s2;
  double s1;
  double q;
  double p2;
  double p1;
  int it_max;
  int i;
  double g;
  double e;
  double ch;
  double cdf_min;
  double cdf_max;
  double c38;
  double c37;
  double c36;
  double c35;
  double c34;
  double c33;
  double c32;
  double c31;
  double c30;
  double c29;
  double c28;
  double c27;
  double c26;
  double c25;
  double c24;
  double c23;
  double c22;
  double c21;
  double c20;
  double c19;
  double c18;
  double c17;
  double c16;
  double c15;
  double c14;
  double c13;
  double c12;
  double c11;
  double c10;
  double c9;
  double c8;
  double c7;
  double c6;
  double c5;
  double c4;
  double c3;
  double c2;
  double c1;
  double c;
  double b;
  double aa;
  double a2;
  double a_local;
  double cdf_local;
  
  if (cdf < 2e-06) {
    std::operator<<((ostream *)&std::cerr," \n");
    std::operator<<((ostream *)&std::cerr,"CHI_SQUARE_CDF_INV - Fatal error!\n");
    std::operator<<((ostream *)&std::cerr,"  CDF < CDF_MIN.\n");
    exit(1);
  }
  if (cdf <= 0.999998) {
    p = a * 0.5;
    dVar1 = p - 1.0;
    dVar2 = lgamma(a / 2.0);
    dVar3 = log(cdf);
    if (dVar3 * -1.24 <= a) {
      if (0.32 < a) {
        dVar3 = normal_01_cdf_inv(cdf);
        dVar5 = sqrt(0.222222 / a);
        _Var4 = std::pow<double,int>((dVar3 * dVar5 + 1.0) - 0.222222 / a,3);
        e = a * _Var4;
        if (a * 2.2 + 6.0 < e) {
          dVar3 = log(1.0 - cdf);
          dVar5 = log(e * 0.5);
          e = (-dVar1 * dVar5 + dVar3 + dVar2) * -2.0;
        }
      }
      else {
        e = 0.4;
        dVar3 = log(1.0 - cdf);
        do {
          dVar5 = e * (e + 4.67) + 1.0;
          dVar6 = e * (e * (e + 6.66) + 6.73);
          dVar7 = exp(dVar1 * 0.6931471806 + e * 0.5 + dVar3 + dVar2);
          dVar5 = e - (1.0 - (dVar7 * dVar6) / dVar5) /
                      (((e + e + 4.67) / dVar5 + -0.5) - (e * (e * 3.0 + 13.32) + 6.73) / dVar6);
          dVar6 = e / dVar5;
          e = dVar5;
        } while (0.01 < ABS(dVar6 - 1.0));
      }
    }
    else {
      dVar3 = exp(p * 0.6931471806 + dVar2);
      e = pow(cdf * p * dVar3,1.0 / p);
      if (e < 5e-07) {
        return e;
      }
    }
    p1._4_4_ = 1;
    while( true ) {
      if (0x14 < p1._4_4_) {
        std::operator<<((ostream *)&std::cout," \n");
        std::operator<<((ostream *)&std::cout,"CHI_SQUARE_CDF_INV - Warning!\n");
        std::operator<<((ostream *)&std::cout,"  Convergence not reached.\n");
        return e;
      }
      dVar3 = r8_gamma_inc(p,e * 0.5);
      dVar5 = log(e);
      dVar5 = exp(-dVar1 * dVar5 + p * 0.6931471806 + dVar2 + e * 0.5);
      dVar5 = (cdf - dVar3) * dVar5;
      dVar3 = dVar5 / e;
      dVar6 = dVar5 * 0.5 + -(dVar3 * dVar1);
      dVar7 = (dVar6 * (dVar6 * (dVar6 * (dVar6 * (dVar6 * 60.0 + 70.0) + 84.0) + 105.0) + 140.0) +
              210.0) / 420.0;
      dVar3 = dVar5 * (-(dVar3 * dVar1) *
                       (-dVar3 * (-dVar3 * (-dVar3 * (-dVar3 * (-dVar3 * ((dVar1 * (dVar1 * 127.0 +
                                                                                   346.0) + 120.0) /
                                                                         5040.0) +
                                                               (dVar1 * (dVar6 * 606.0 + 175.0) +
                                                               dVar6 * 264.0 + 84.0) / 2520.0) +
                                                     (dVar1 * (dVar6 * (dVar6 * 1740.0 + 889.0) +
                                                              294.0) +
                                                     dVar6 * (dVar6 * 1182.0 + 672.0) + 252.0) /
                                                     5040.0) +
                                           (dVar6 * (dVar6 * (dVar6 * 932.0 + 707.0) + 462.0) +
                                           210.0) / 2520.0) +
                                 (dVar6 * (dVar6 * (dVar6 * (dVar6 * 1278.0 + 1141.0) + 966.0) +
                                          735.0) + 420.0) / 2520.0) + dVar7) +
                      dVar5 * 0.5 * dVar7 + 1.0) + e;
      if (5e-07 < ABS(e / dVar3 - 1.0)) break;
      p1._4_4_ = p1._4_4_ + 1;
      e = dVar3;
    }
    return dVar3;
  }
  std::operator<<((ostream *)&std::cerr," \n");
  std::operator<<((ostream *)&std::cerr,"CHI_SQUARE_CDF_INV - Fatal error!\n");
  std::operator<<((ostream *)&std::cerr,"  CDF_MAX < CDF.\n");
  exit(1);
}

Assistant:

double chi_square_cdf_inv ( double cdf, double a )

//****************************************************************************80
//
//  Purpose:
//
//    CHI_SQUARE_CDF_INV inverts the Chi squared PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    12 October 2004
//
//  Author:
//
//    Original FORTRAN77 version by Best and Roberts.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Best, Roberts,
//    The Percentage Points of the Chi-Squared Distribution,
//    Algorithm AS 91,
//    Applied Statistics,
//    Volume 24, Number ?, pages 385-390, 1975.
//
//  Parameters:
//
//    Input, double CDF, a value of the chi-squared cumulative
//    probability density function.
//    0.000002 <= CDF <= 0.999998.
//
//    Input, double A, the parameter of the chi-squared
//    probability density function.  0 < A.
//
//    Output, double CHI_SQUARE_CDF_INV, the value of the chi-squared random deviate
//    with the property that the probability that a chi-squared random
//    deviate with parameter A is less than or equal to X is CDF.
//
{
  double a2;
  double aa = 0.6931471806;
  double b;
  double c;
  double c1 = 0.01;
  double c2 = 0.222222;
  double c3 = 0.32;
  double c4 = 0.4;
  double c5 = 1.24;
  double c6 = 2.2;
  double c7 = 4.67;
  double c8 = 6.66;
  double c9 = 6.73;
  double c10 = 13.32;
  double c11 = 60.0;
  double c12 = 70.0;
  double c13 = 84.0;
  double c14 = 105.0;
  double c15 = 120.0;
  double c16 = 127.0;
  double c17 = 140.0;
  double c18 = 175.0;
  double c19 = 210.0;
  double c20 = 252.0;
  double c21 = 264.0;
  double c22 = 294.0;
  double c23 = 346.0;
  double c24 = 420.0;
  double c25 = 462.0;
  double c26 = 606.0;
  double c27 = 672.0;
  double c28 = 707.0;
  double c29 = 735.0;
  double c30 = 889.0;
  double c31 = 932.0;
  double c32 = 966.0;
  double c33 = 1141.0;
  double c34 = 1182.0;
  double c35 = 1278.0;
  double c36 = 1740.0;
  double c37 = 2520.0;
  double c38 = 5040.0;
  double cdf_max = 0.999998;
  double cdf_min = 0.000002;
  double ch;
  double e = 0.0000005;
  double g;
  int i;
  int it_max = 20;
  double p1;
  double p2;
  double q;
  double s1;
  double s2;
  double s3;
  double s4;
  double s5;
  double s6;
  double t;
  double x;
  double x2;
  double xx;
//
  if ( cdf < cdf_min )
  {
    x = -1.0;
    cerr << " \n";
    cerr << "CHI_SQUARE_CDF_INV - Fatal error!\n";
    cerr << "  CDF < CDF_MIN.\n";
    exit ( 1 );
  }

  if ( cdf_max < cdf )
  {
    x = -1.0;
    cerr << " \n";
    cerr << "CHI_SQUARE_CDF_INV - Fatal error!\n";
    cerr << "  CDF_MAX < CDF.\n";
    exit ( 1 );
  }

  xx = 0.5 * a;
  c = xx - 1.0;
//
//  Compute Log ( Gamma ( A/2 ) ).
//
  g = lgamma ( a / 2.0 );
//
//  Starting approximation for small chi-squared.
//
  if ( a < -c5 * log ( cdf ) )
  {
    ch = pow ( ( cdf * xx * exp ( g + xx * aa ) ), ( 1.0 / xx ) );

    if ( ch < e )
    {
      x = ch;
      return x;
    }
  }
//
//  Starting approximation for A less than or equal to 0.32.
//
  else if ( a <= c3 )
  {
    ch = c4;
    a2 = log ( 1.0 - cdf );

    for ( ; ; )
    {
      q = ch;
      p1 = 1.0 + ch * ( c7 + ch );
      p2 = ch * ( c9 + ch * ( c8 + ch ) );

      t = - 0.5 + ( c7 + 2.0 * ch ) / p1 - ( c9 + ch * ( c10 + 3.0 * ch ) ) / p2;

      ch = ch - ( 1.0 - exp ( a2 + g + 0.5 * ch + c * aa ) * p2 / p1 ) / t;

      if ( fabs ( q / ch - 1.0 ) <= c1 )
      {
        break;
      }
    }
  }
//
//  Call to algorithm AS 111.
//  Note that P has been tested above.
//  AS 241 could be used as an alternative.
//
  else
  {
    x2 = normal_01_cdf_inv ( cdf );
//
//  Starting approximation using Wilson and Hilferty estimate.
//
    p1 = c2 / a;
    ch = a * pow ( ( x2 * sqrt ( p1 ) + 1.0 - p1 ), 3 );
//
//  Starting approximation for P tending to 1.
//
    if ( c6 * a + 6.0 < ch )
    {
      ch = - 2.0 * ( log ( 1.0 - cdf ) - c * log ( 0.5 * ch ) + g );
    }
  }
//
//  Call to algorithm AS 239 and calculation of seven term Taylor series.
//
  for ( i = 1; i <= it_max; i++ )
  {
    q = ch;
    p1 = 0.5 * ch;
    p2 = cdf - r8_gamma_inc ( xx, p1 );
    t = p2 * exp ( xx * aa + g + p1 - c * log ( ch ) );
    b = t / ch;
    a2 = 0.5 * t - b * c;

    s1 = ( c19 + a2
       * ( c17 + a2
       * ( c14 + a2
       * ( c13 + a2
       * ( c12 + a2
       *   c11 ) ) ) ) ) / c24;

    s2 = ( c24 + a2
       * ( c29 + a2
       * ( c32 + a2
       * ( c33 + a2
       *   c35 ) ) ) ) / c37;

    s3 = ( c19 + a2
       * ( c25 + a2
       * ( c28 + a2
       *   c31 ) ) ) / c37;

    s4 = ( c20 + a2
       * ( c27 + a2
       *   c34 ) + c
       * ( c22 + a2
       * ( c30 + a2
       *   c36 ) ) ) / c38;

    s5 = ( c13 + c21 * a2 + c * ( c18 + c26 * a2 ) ) / c37;

    s6 = ( c15 + c * ( c23 + c16 * c ) ) / c38;

    ch = ch + t * ( 1.0 + 0.5 * t * s1 - b * c
      * ( s1 - b
      * ( s2 - b
      * ( s3 - b
      * ( s4 - b
      * ( s5 - b
      *   s6 ) ) ) ) ) );

    if ( e < fabs ( q / ch - 1.0 ) )
    {
      x = ch;
      return x;
    }

  }

  x = ch;
  cout << " \n";
  cout << "CHI_SQUARE_CDF_INV - Warning!\n";
  cout << "  Convergence not reached.\n";

  return x;
}